

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

FrameIndex __thiscall iDynTree::Model::getFrameIndex(Model *this,string *frameName)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pcVar3;
  size_t sVar4;
  int iVar5;
  ostream *poVar6;
  size_type *psVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  stringstream ss;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pLVar1 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar2 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar9 = ((long)pLVar1 - (long)pLVar2 >> 4) * 0x6db6db6db6db6db7;
  bVar13 = pLVar1 != pLVar2;
  if (pLVar1 == pLVar2) {
    uVar10 = 0;
  }
  else {
    pcVar3 = (frameName->_M_dataplus)._M_p;
    sVar4 = frameName->_M_string_length;
    uVar10 = uVar9 + (uVar9 == 0);
    psVar7 = &((this->linkNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    uVar11 = 0;
    do {
      if ((sVar4 == *psVar7) &&
         ((sVar4 == 0 ||
          (iVar5 = bcmp(pcVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(psVar7 + -1))->_M_dataplus)._M_p,sVar4), iVar5 == 0)))) {
        uVar10 = uVar11;
        if (bVar13) {
          return uVar11;
        }
        break;
      }
      uVar11 = uVar11 + 1;
      bVar13 = uVar11 < uVar9;
      psVar7 = psVar7 + 4;
    } while (uVar10 != uVar11);
  }
  lVar8 = ((long)(this->additionalFrames).
                 super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->additionalFrames).
                 super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  uVar11 = lVar8 + uVar9;
  bVar13 = uVar9 < uVar11;
  uVar12 = uVar10;
  if (bVar13) {
    pcVar3 = (frameName->_M_dataplus)._M_p;
    sVar4 = frameName->_M_string_length;
    psVar7 = &((this->frameNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    do {
      if ((sVar4 == *psVar7) &&
         ((uVar12 = uVar9, sVar4 == 0 ||
          (iVar5 = bcmp(pcVar3,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(psVar7 + -1))->_M_dataplus)._M_p,sVar4), iVar5 == 0)))) break;
      uVar9 = uVar9 + 1;
      bVar13 = uVar9 < uVar11;
      psVar7 = psVar7 + 4;
      lVar8 = lVar8 + -1;
      uVar12 = uVar10;
    } while (lVar8 != 0);
  }
  if (!bVar13) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Frame named ",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(frameName->_M_dataplus)._M_p,frameName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," not found in the model.",0x18);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("Model","getFrameIndex",(char *)local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    uVar12 = FRAME_INVALID_INDEX;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return uVar12;
}

Assistant:

FrameIndex Model::getFrameIndex(const std::string& frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return (FrameIndex)i;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return (FrameIndex)i;
        }
    }

    std::stringstream ss;
    ss << "Frame named " << frameName << " not found in the model.";
    reportError("Model","getFrameIndex",ss.str().c_str());
    return FRAME_INVALID_INDEX;
}